

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_impl.hpp
# Opt level: O0

void __thiscall
Catch::
MatchExpr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Catch::Matchers::RangeEqualsMatcher<std::array<const_char_*,_3UL>,_std::equal_to<void>_>_>
::streamReconstructedExpression
          (MatchExpr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Catch::Matchers::RangeEqualsMatcher<std::array<const_char_*,_3UL>,_std::equal_to<void>_>_>
           *this,ostream *os)

{
  ostream *poVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string local_68;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  MatchExpr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Catch::Matchers::RangeEqualsMatcher<std::array<const_char_*,_3UL>,_std::equal_to<void>_>_>
  *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_38,(Detail *)this->m_arg,in_RDX);
  poVar1 = std::operator<<(os,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,' ');
  Matchers::MatcherUntypedBase::toString_abi_cxx11_(&local_68,(MatcherUntypedBase *)this->m_matcher)
  ;
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }